

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
          (EncodedDescriptorDatabase *this,string *symbol_name,string *output)

{
  bool bVar1;
  uint uVar2;
  uint8 *data;
  int size;
  pair<const_void_*,_int> pVar3;
  CodedInputStream input;
  FileDescriptorProto file_proto;
  CodedInputStream local_138;
  FileDescriptorProto local_e8;
  
  pVar3 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindSymbol
                    (&this->index_,symbol_name);
  data = (uint8 *)pVar3.first;
  if (data == (uint8 *)0x0) {
    bVar1 = false;
  }
  else {
    size = pVar3.second;
    local_138.input_ = (ZeroCopyInputStream *)0x0;
    local_138.buffer_end_ = data + size;
    local_138.overflow_bytes_ = 0;
    local_138.last_tag_ = 0;
    local_138.legitimate_message_end_ = false;
    local_138.aliasing_enabled_ = false;
    local_138.buffer_size_after_limit_ = 0;
    local_138.total_bytes_limit_ = 0x4000000;
    local_138.total_bytes_warning_threshold_ = 0x2000000;
    local_138.recursion_depth_ = 0;
    local_138.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
    local_138.extension_pool_ = (DescriptorPool *)0x0;
    local_138.extension_factory_ = (MessageFactory *)0x0;
    local_138.total_bytes_read_ = size;
    local_138.current_limit_ = size;
    if ((size < 1) || (uVar2 = (uint)(char)*data, (char)*data < '\0')) {
      local_138.buffer_ = data;
      uVar2 = io::CodedInputStream::ReadTagFallback(&local_138);
      local_138.last_tag_ = uVar2;
    }
    else {
      local_138._28_8_ = (ulong)uVar2 << 0x20;
      local_138.buffer_ = data + 1;
    }
    if (uVar2 == 10) {
      bVar1 = internal::WireFormatLite::ReadString(&local_138,output);
    }
    else {
      FileDescriptorProto::FileDescriptorProto(&local_e8);
      bVar1 = MessageLite::ParseFromArray((MessageLite *)&local_e8,data,size);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)output);
      }
      FileDescriptorProto::~FileDescriptorProto(&local_e8);
    }
    io::CodedInputStream::~CodedInputStream(&local_138);
  }
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::FindNameOfFileContainingSymbol(
    const string& symbol_name,
    string* output) {
  pair<const void*, int> encoded_file = index_.FindSymbol(symbol_name);
  if (encoded_file.first == NULL) return false;

  // Optimization:  The name should be the first field in the encoded message.
  //   Try to just read it directly.
  io::CodedInputStream input(reinterpret_cast<const uint8*>(encoded_file.first),
                             encoded_file.second);

  const uint32 kNameTag = internal::WireFormatLite::MakeTag(
      FileDescriptorProto::kNameFieldNumber,
      internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

  if (input.ReadTag() == kNameTag) {
    // Success!
    return internal::WireFormatLite::ReadString(&input, output);
  } else {
    // Slow path.  Parse whole message.
    FileDescriptorProto file_proto;
    if (!file_proto.ParseFromArray(encoded_file.first, encoded_file.second)) {
      return false;
    }
    *output = file_proto.name();
    return true;
  }
}